

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

void arg_rex_errorfn(arg_rex *parent,FILE *fp,int errorcode,char *argval,char *progname)

{
  char *shortopts;
  char *longopts;
  char *datatype;
  char *pcVar1;
  
  shortopts = (parent->hdr).shortopts;
  longopts = (parent->hdr).longopts;
  pcVar1 = (parent->hdr).datatype;
  datatype = "";
  if (argval != (char *)0x0) {
    datatype = argval;
  }
  fprintf((FILE *)fp,"%s: ",progname);
  if (errorcode == 7) {
    pcVar1 = "illegal value  ";
  }
  else {
    if (errorcode != 2) {
      if (errorcode != 1) {
        return;
      }
      fputs("missing option ",(FILE *)fp);
      datatype = pcVar1;
      goto LAB_00106249;
    }
    pcVar1 = "excess option ";
  }
  fputs(pcVar1,(FILE *)fp);
LAB_00106249:
  arg_print_option(fp,shortopts,longopts,datatype,"\n");
  return;
}

Assistant:

static void arg_rex_errorfn(struct arg_rex * parent,
							FILE * fp,
							int errorcode,
							const char * argval,
							const char * progname) {
	const char * shortopts = parent->hdr.shortopts;
	const char * longopts  = parent->hdr.longopts;
	const char * datatype  = parent->hdr.datatype;

	/* make argval NULL safe */
	argval = argval ? argval : "";

	fprintf(fp, "%s: ", progname);

	switch (errorcode) {
		case EMINCOUNT:
			fputs("missing option ", fp);
			arg_print_option(fp, shortopts, longopts, datatype, "\n");
			break;

		case EMAXCOUNT:
			fputs("excess option ", fp);
			arg_print_option(fp, shortopts, longopts, argval, "\n");
			break;

		case EREGNOMATCH:
			fputs("illegal value  ", fp);
			arg_print_option(fp, shortopts, longopts, argval, "\n");
			break;

		default: {
			//char errbuff[256];
			//regerror(errorcode, NULL, errbuff, sizeof(errbuff));
			//printf("%s\n", errbuff);
		}
		break;
	}
}